

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

intmatrix sptk::swipe::onesim(int xSz,int ySz)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  intmatrix iVar14;
  
  iVar14 = makeim(xSz,ySz);
  auVar4 = _DAT_0012bf60;
  auVar3 = _DAT_0012bcc0;
  auVar2 = _DAT_0012bcb0;
  if (0 < iVar14.x) {
    lVar5 = (iVar14._0_8_ >> 0x20) - 1;
    auVar8._8_4_ = (int)lVar5;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar8 = auVar8 ^ _DAT_0012bcc0;
    do {
      if (0 < iVar14.y) {
        piVar1 = iVar14.m[uVar6];
        uVar7 = 0;
        auVar10 = auVar2;
        auVar11 = auVar4;
        do {
          auVar12 = auVar10 ^ auVar3;
          iVar9 = auVar8._4_4_;
          if ((bool)(~(auVar12._4_4_ == iVar9 && auVar8._0_4_ < auVar12._0_4_ ||
                      iVar9 < auVar12._4_4_) & 1)) {
            piVar1[uVar7] = 1;
          }
          if ((auVar12._12_4_ != auVar8._12_4_ || auVar12._8_4_ <= auVar8._8_4_) &&
              auVar12._12_4_ <= auVar8._12_4_) {
            piVar1[uVar7 + 1] = 1;
          }
          auVar12 = auVar11 ^ auVar3;
          iVar13 = auVar12._4_4_;
          if (iVar13 <= iVar9 && (iVar13 != iVar9 || auVar12._0_4_ <= auVar8._0_4_)) {
            piVar1[uVar7 + 2] = 1;
            piVar1[uVar7 + 3] = 1;
          }
          uVar7 = uVar7 + 4;
          lVar5 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 4;
          auVar10._8_8_ = lVar5 + 4;
          lVar5 = auVar11._8_8_;
          auVar11._0_8_ = auVar11._0_8_ + 4;
          auVar11._8_8_ = lVar5 + 4;
        } while ((iVar14.y + 3U & 0xfffffffc) != uVar7);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (iVar14.x & 0x7fffffff));
  }
  return iVar14;
}

Assistant:

intmatrix onesim(int xSz, int ySz) {
    int i, j;
    intmatrix nw_matrix = makeim(xSz, ySz);
    for (i = 0; i < nw_matrix.x; i++)
        for (j = 0; j < nw_matrix.y; j++)
            nw_matrix.m[i][j] = 1;
    return(nw_matrix);
}